

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O2

bool __thiscall
DIS::IntercomControlPdu::operator==(IntercomControlPdu *this,IntercomControlPdu *rhs)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uchar uVar5;
  uchar uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  pointer pIVar15;
  unkbyte10 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [12];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined4 uVar25;
  size_t idx;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar36 [16];
  undefined1 auVar29 [16];
  undefined1 auVar37 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar38 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar39 [16];
  undefined1 auVar35 [16];
  undefined1 auVar34 [16];
  undefined2 uVar40;
  
  bVar22 = RadioCommunicationsFamilyPdu::operator==
                     (&this->super_RadioCommunicationsFamilyPdu,
                      &rhs->super_RadioCommunicationsFamilyPdu);
  cVar1 = (rhs->super_RadioCommunicationsFamilyPdu).field_0x2a;
  cVar2 = (rhs->super_RadioCommunicationsFamilyPdu).field_0x2b;
  cVar3 = (this->super_RadioCommunicationsFamilyPdu).field_0x2a;
  cVar4 = (this->super_RadioCommunicationsFamilyPdu).field_0x2b;
  bVar23 = EntityID::operator==(&this->_sourceEntityID,&rhs->_sourceEntityID);
  uVar5 = rhs->_sourceCommunicationsDeviceID;
  uVar6 = this->_sourceCommunicationsDeviceID;
  uVar7 = this->_sourceLineID;
  uVar9 = this->_transmitPriority;
  uVar11 = this->_transmitLineState;
  uVar13 = this->_command;
  uVar8 = rhs->_sourceLineID;
  uVar10 = rhs->_transmitPriority;
  uVar12 = rhs->_transmitLineState;
  uVar14 = rhs->_command;
  bVar24 = EntityID::operator==(&this->_masterEntityID,&rhs->_masterEntityID);
  Var16 = CONCAT19(0xff,CONCAT18(0xff,0xff00000000000000));
  auVar17[10] = 0xff;
  auVar17._0_10_ = Var16;
  auVar18[0xb] = 0xff;
  auVar18._0_11_ = auVar17;
  auVar19[0xc] = 0xff;
  auVar19._0_12_ = auVar18;
  auVar35[0xd] = 0xff;
  auVar35._0_13_ = auVar19;
  auVar35[0xe] = 0xff;
  auVar35[0xf] = 0xff;
  auVar34._14_2_ = auVar35._14_2_;
  auVar34[0xd] = 0xff;
  auVar34._0_13_ = auVar19;
  auVar33._13_3_ = auVar34._13_3_;
  auVar33[0xc] = 0xff;
  auVar33._0_12_ = auVar18;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32[0xb] = 0xff;
  auVar32._0_11_ = auVar17;
  auVar31._11_5_ = auVar32._11_5_;
  auVar31[10] = 0xff;
  auVar31._0_10_ = Var16;
  auVar30._10_6_ = auVar31._10_6_;
  auVar30[9] = 0xff;
  auVar30._0_9_ = CONCAT18(0xff,0xff00000000000000);
  auVar29._9_7_ = auVar30._9_7_;
  auVar29[8] = 0xff;
  auVar29._0_8_ = 0xff00000000000000;
  Var16 = CONCAT91(CONCAT81(auVar29._8_8_,-(uVar14 == uVar13)),-(uVar14 == uVar13));
  auVar21._2_10_ = Var16;
  auVar21[1] = -(uVar12 == uVar11);
  auVar21[0] = -(uVar12 == uVar11);
  auVar20._2_12_ = auVar21;
  auVar20[1] = -(uVar10 == uVar9);
  auVar20[0] = -(uVar10 == uVar9);
  auVar28._0_2_ = CONCAT11(-(uVar8 == uVar7),-(uVar8 == uVar7));
  auVar28._2_14_ = auVar20;
  uVar40 = (undefined2)Var16;
  auVar39._0_12_ = auVar28._0_12_;
  auVar39._12_2_ = uVar40;
  auVar39._14_2_ = uVar40;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = auVar28._0_10_;
  auVar38._10_2_ = auVar21._0_2_;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = auVar28._0_8_;
  auVar37._8_2_ = auVar21._0_2_;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._6_2_ = auVar20._0_2_;
  auVar36._4_2_ = auVar20._0_2_;
  auVar36._2_2_ = auVar28._0_2_;
  auVar36._0_2_ = auVar28._0_2_;
  uVar25 = movmskps((uint)rhs->_masterCommunicationsDeviceID,auVar36);
  bVar22 = (((bVar24 && bVar23) && bVar22) &&
           this->_masterCommunicationsDeviceID == rhs->_masterCommunicationsDeviceID) &&
           (((uVar5 == uVar6 && cVar2 == cVar4) && (char)uVar25 == '\x0f') && cVar1 == cVar3);
  lVar27 = 0;
  for (uVar26 = 0;
      pIVar15 = (this->_intercomParameters).
                super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar26 < (ulong)((long)(this->_intercomParameters).
                             super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar15 >> 4);
      uVar26 = uVar26 + 1) {
    bVar23 = IntercomCommunicationsParameters::operator==
                       ((IntercomCommunicationsParameters *)
                        ((long)&pIVar15->_vptr_IntercomCommunicationsParameters + lVar27),
                        (IntercomCommunicationsParameters *)
                        ((long)&((rhs->_intercomParameters).
                                 super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                                _vptr_IntercomCommunicationsParameters + lVar27));
    bVar22 = (bool)(bVar22 & bVar23);
    lVar27 = lVar27 + 0x10;
  }
  return bVar22;
}

Assistant:

bool IntercomControlPdu::operator ==(const IntercomControlPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

     if( ! (_controlType == rhs._controlType) ) ivarsEqual = false;
     if( ! (_communicationsChannelType == rhs._communicationsChannelType) ) ivarsEqual = false;
     if( ! (_sourceEntityID == rhs._sourceEntityID) ) ivarsEqual = false;
     if( ! (_sourceCommunicationsDeviceID == rhs._sourceCommunicationsDeviceID) ) ivarsEqual = false;
     if( ! (_sourceLineID == rhs._sourceLineID) ) ivarsEqual = false;
     if( ! (_transmitPriority == rhs._transmitPriority) ) ivarsEqual = false;
     if( ! (_transmitLineState == rhs._transmitLineState) ) ivarsEqual = false;
     if( ! (_command == rhs._command) ) ivarsEqual = false;
     if( ! (_masterEntityID == rhs._masterEntityID) ) ivarsEqual = false;
     if( ! (_masterCommunicationsDeviceID == rhs._masterCommunicationsDeviceID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _intercomParameters.size(); idx++)
     {
        if( ! ( _intercomParameters[idx] == rhs._intercomParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }